

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O1

void FRandom::StaticPrintSeeds(void)

{
  int iVar1;
  FRandom *pFVar2;
  
  if (RNGList != (FRandom *)0x0) {
    pFVar2 = RNGList;
    do {
      iVar1 = pFVar2->idx;
      if (0x13 < pFVar2->idx) {
        iVar1 = 0;
      }
      Printf("%s: %08x .. %d\n",pFVar2->Name,(ulong)*(uint *)((long)&pFVar2->sfmt + (long)iVar1 * 4)
            );
      pFVar2 = pFVar2->Next;
    } while (pFVar2 != (FRandom *)0x0);
  }
  return;
}

Assistant:

void FRandom::StaticPrintSeeds ()
{
	FRandom *rng = RNGList;

	while (rng != NULL)
	{
		int idx = rng->idx < SFMT::N32 ? rng->idx : 0;
		Printf ("%s: %08x .. %d\n", rng->Name, rng->sfmt.u[idx], idx);
		rng = rng->Next;
	}
}